

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHtmlElement.cpp
# Opt level: O0

void __thiscall KDReports::HtmlElement::HtmlElement(HtmlElement *this,HtmlElement *other)

{
  HtmlElementPrivate *this_00;
  type pHVar1;
  HtmlElement *other_local;
  HtmlElement *this_local;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__HtmlElement_001c81f8;
  this_00 = (HtmlElementPrivate *)operator_new(0x30);
  pHVar1 = std::
           unique_ptr<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
           ::operator*(&other->d);
  HtmlElementPrivate::HtmlElementPrivate(this_00,pHVar1);
  std::unique_ptr<KDReports::HtmlElementPrivate,std::default_delete<KDReports::HtmlElementPrivate>>
  ::unique_ptr<std::default_delete<KDReports::HtmlElementPrivate>,void>
            ((unique_ptr<KDReports::HtmlElementPrivate,std::default_delete<KDReports::HtmlElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::HtmlElement::HtmlElement(const HtmlElement &other)
    : Element(other)
    , d(new HtmlElementPrivate(*other.d))
{
}